

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Real Omega_h::repro_sum(Reals *a)

{
  int *piVar1;
  Alloc *pAVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  ulong uVar7;
  Now b;
  Real RVar8;
  double dVar9;
  Real RVar10;
  Int128 fixpt_sum;
  Reals local_48;
  Int128 local_38;
  Reals local_28;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar7 = pAVar2->size;
  }
  else {
    uVar7 = (ulong)pAVar2 >> 3;
  }
  RVar8 = 0.0;
  if ((int)(uVar7 >> 3) != 0) {
    begin_code("repro_sum",(char *)0x0);
    local_28.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_28.write_.shared_alloc_.alloc =
             (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_28.write_.shared_alloc_.alloc)->use_count =
             (local_28.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_28.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    iVar6 = max_exponent(&local_28);
    pAVar2 = local_28.write_.shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_28.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_28.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    dVar9 = ldexp(1.0,iVar6 + -0x34);
    local_48.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_38 = int128_sum(&local_48,dVar9);
    pAVar2 = local_48.write_.shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    RVar8 = Int128::to_double(&local_38,dVar9);
    plVar5 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      dVar9 = *(double *)
               (*profile::global_singleton_history + 0x30 +
               profile::global_singleton_history[3] * 0x40);
      b = now();
      RVar10 = operator-(b,(Impl)((Impl *)(*plVar5 + 0x28 + plVar5[3] * 0x40))->__d);
      lVar3 = *plVar5;
      lVar4 = plVar5[3];
      *(double *)(lVar3 + 0x30 + lVar4 * 0x40) = RVar10 + dVar9;
      plVar5[3] = *(long *)(lVar3 + lVar4 * 0x40);
    }
  }
  return RVar8;
}

Assistant:

Real repro_sum(Reals a) {
  if (a.size() == 0) {
    return 0.0;
  }
  begin_code("repro_sum");
  int expo = max_exponent(a);
  auto const init = ArithTraits<int>::min();
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}